

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManPrintInitClasses(Vec_Int_t *vInits)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  int Counts [6];
  int local_38 [8];
  
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_38[4] = 0;
  local_38[5] = 0;
  iVar1 = vInits->nSize;
  if (0 < (long)iVar1) {
    piVar3 = vInits->pArray;
    lVar4 = 0;
    do {
      local_38[piVar3[lVar4]] = local_38[piVar3[lVar4]] + 1;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  uVar5 = 0;
  do {
    if (local_38[uVar5] != 0) {
      printf("%d = %d  ",uVar5 & 0xffffffff);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 6);
  printf("  ");
  printf("B = %d  ",(ulong)(uint)(local_38[1] + local_38[0]));
  printf("X = %d  ",(ulong)(uint)(local_38[3] + local_38[2]));
  printf("Q = %d\n",(ulong)(uint)(local_38[5] + local_38[4]));
  if (0 < vInits->nSize) {
    lVar4 = 0;
    do {
      uVar2 = vInits->pArray[lVar4];
      local_38[(int)uVar2] = local_38[(int)uVar2] + 1;
      if (5 < (ulong)(long)(int)uVar2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                      ,0x17f,"void Gia_ManPrintInitClasses(Vec_Int_t *)");
      }
      putchar(uVar2 | 0x30);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vInits->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManPrintInitClasses( Vec_Int_t * vInits )
{
    int i, Value;
    int Counts[6] = {0};
    Vec_IntForEachEntry( vInits, Value, i )
        Counts[Value]++;
    for ( i = 0; i < 6; i++ )
        if ( Counts[i] )
            printf( "%d = %d  ", i, Counts[i] );
    printf( "  " );
    printf( "B = %d  ", Counts[0] + Counts[1] );
    printf( "X = %d  ", Counts[2] + Counts[3] );
    printf( "Q = %d\n", Counts[4] + Counts[5] );
    Vec_IntForEachEntry( vInits, Value, i )
    {
        Counts[Value]++;
        if ( Value == 0 )
            printf( "0" );
        else if ( Value == 1 )
            printf( "1" );
        else if ( Value == 2 )
            printf( "2" );
        else if ( Value == 3 )
            printf( "3" );
        else if ( Value == 4 )
            printf( "4" );
        else if ( Value == 5 )
            printf( "5" );
        else assert( 0 );
    }
    printf( "\n" );
    
}